

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O1

void __thiscall CDBBatch::WriteImpl(CDBBatch *this,Span<const_std::byte> key,DataStream *ssValue)

{
  long in_FS_OFFSET;
  Slice slValue;
  Slice slKey;
  Slice local_40;
  Slice local_30;
  long local_20;
  
  local_30.size_ = key.m_size;
  local_30.data_ = (char *)key.m_data;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::Xor(ssValue,&this->parent->obfuscate_key);
  local_40.data_ =
       (char *)((ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_start + ssValue->m_read_pos);
  local_40.size_ =
       (long)(ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_40.data_;
  leveldb::WriteBatch::Put
            (&((this->m_impl_batch)._M_t.
               super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>
               ._M_t.
               super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
               .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl)->batch,
             &local_30,&local_40);
  this->size_estimate =
       local_30.size_ + local_40.size_ + (ulong)(0x7f < local_30.size_) + this->size_estimate +
       (ulong)(0x7f < local_40.size_) + 3;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDBBatch::WriteImpl(Span<const std::byte> key, DataStream& ssValue)
{
    leveldb::Slice slKey(CharCast(key.data()), key.size());
    ssValue.Xor(dbwrapper_private::GetObfuscateKey(parent));
    leveldb::Slice slValue(CharCast(ssValue.data()), ssValue.size());
    m_impl_batch->batch.Put(slKey, slValue);
    // LevelDB serializes writes as:
    // - byte: header
    // - varint: key length (1 byte up to 127B, 2 bytes up to 16383B, ...)
    // - byte[]: key
    // - varint: value length
    // - byte[]: value
    // The formula below assumes the key and value are both less than 16k.
    size_estimate += 3 + (slKey.size() > 127) + slKey.size() + (slValue.size() > 127) + slValue.size();
}